

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder_mf.c
# Opt level: O0

uint32_t lzma_mf_hc4_find(lzma_mf *mf,lzma_match *matches)

{
  uint32_t cur_match_00;
  uint32_t pos_00;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  byte *cur_00;
  lzma_match *plVar5;
  uint32_t local_5c;
  uint local_58;
  uint32_t len_limit;
  uint32_t matches_count;
  uint32_t len_best;
  uint32_t cur_match;
  uint32_t delta3;
  uint32_t delta2;
  uint32_t hash_3_value;
  uint32_t hash_2_value;
  uint32_t hash_value;
  uint32_t temp;
  uint32_t pos;
  uint8_t *cur;
  lzma_match *matches_local;
  lzma_mf *mf_local;
  
  len_limit = 1;
  local_58 = 0;
  local_5c = mf_avail(mf);
  if (local_5c < mf->nice_len) {
    if (local_5c < 4) {
      if (mf->action != LZMA_RUN) {
        move_pending(mf);
        return 0;
      }
      __assert_fail("mf->action != LZMA_RUN",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lz/lz_encoder_mf.c"
                    ,0x18a,"uint32_t lzma_mf_hc4_find(lzma_mf *, lzma_match *)");
    }
  }
  else {
    local_5c = mf->nice_len;
  }
  cur_00 = mf_ptr(mf);
  pos_00 = mf->read_pos + mf->offset;
  uVar1 = lzma_crc32_table[0][*cur_00] ^ (uint)cur_00[1];
  uVar2 = (uVar1 ^ (uint)cur_00[2] << 8) & 0xffff;
  uVar3 = (uVar1 ^ (uint)cur_00[2] << 8 ^ lzma_crc32_table[0][cur_00[3]] << 5) & mf->hash_mask;
  cur_match = pos_00 - mf->hash[uVar1 & 0x3ff];
  uVar4 = pos_00 - mf->hash[uVar2 + 0x400];
  cur_match_00 = mf->hash[uVar3 + 0x10400];
  mf->hash[uVar1 & 0x3ff] = pos_00;
  mf->hash[uVar2 + 0x400] = pos_00;
  mf->hash[uVar3 + 0x10400] = pos_00;
  if ((cur_match < mf->cyclic_size) && (cur_00[-(ulong)cur_match] == *cur_00)) {
    len_limit = 2;
    matches->len = 2;
    matches->dist = cur_match - 1;
    local_58 = 1;
  }
  if (((cur_match != uVar4) && (uVar4 < mf->cyclic_size)) && (cur_00[-(ulong)uVar4] == *cur_00)) {
    len_limit = 3;
    matches[local_58].dist = uVar4 - 1;
    local_58 = local_58 + 1;
    cur_match = uVar4;
  }
  if (local_58 != 0) {
    for (; (len_limit != local_5c &&
           (cur_00[(ulong)len_limit - (ulong)cur_match] == cur_00[len_limit]));
        len_limit = len_limit + 1) {
    }
    matches[local_58 - 1].len = len_limit;
    if (len_limit == local_5c) {
      mf->son[mf->cyclic_pos] = cur_match_00;
      move_pos(mf);
      return local_58;
    }
  }
  if (len_limit < 3) {
    len_limit = 3;
  }
  plVar5 = hc_find_func(local_5c,pos_00,cur_00,cur_match_00,mf->depth,mf->son,mf->cyclic_pos,
                        mf->cyclic_size,matches + local_58,len_limit);
  move_pos(mf);
  return (uint32_t)((long)plVar5 - (long)matches >> 3);
}

Assistant:

extern uint32_t
lzma_mf_hc4_find(lzma_mf *mf, lzma_match *matches)
{
	const uint8_t *cur;
	uint32_t pos;
	uint32_t temp, hash_value, hash_2_value, hash_3_value; /* hash_4_calc */
	uint32_t delta2, delta3, cur_match;
	uint32_t len_best = 1;
	uint32_t matches_count = 0;

	header_find(false, 4);

	hash_4_calc();

	delta2 = pos - mf->hash[hash_2_value];
	delta3 = pos - mf->hash[FIX_3_HASH_SIZE + hash_3_value];
	cur_match = mf->hash[FIX_4_HASH_SIZE + hash_value];

	mf->hash[hash_2_value ] = pos;
	mf->hash[FIX_3_HASH_SIZE + hash_3_value] = pos;
	mf->hash[FIX_4_HASH_SIZE + hash_value] = pos;

	if (delta2 < mf->cyclic_size && *(cur - delta2) == *cur) {
		len_best = 2;
		matches[0].len = 2;
		matches[0].dist = delta2 - 1;
		matches_count = 1;
	}

	if (delta2 != delta3 && delta3 < mf->cyclic_size
			&& *(cur - delta3) == *cur) {
		len_best = 3;
		matches[matches_count++].dist = delta3 - 1;
		delta2 = delta3;
	}

	if (matches_count != 0) {
		for ( ; len_best != len_limit; ++len_best)
			if (*(cur + len_best - delta2) != cur[len_best])
				break;

		matches[matches_count - 1].len = len_best;

		if (len_best == len_limit) {
			hc_skip();
			return matches_count;
		}
	}

	if (len_best < 3)
		len_best = 3;

	hc_find(len_best);
}